

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModelBullet.cpp
# Opt level: O2

void __thiscall
chrono::collision::ChCollisionModelBullet::ChCollisionModelBullet(ChCollisionModelBullet *this)

{
  unique_ptr<cbtCollisionObject,_std::default_delete<cbtCollisionObject>_> *puVar1;
  cbtCollisionObject *pcVar2;
  cbtCollisionObject *this_00;
  
  ChCollisionModel::ChCollisionModel(&this->super_ChCollisionModel);
  puVar1 = &this->bt_collision_object;
  (this->super_ChCollisionModel)._vptr_ChCollisionModel =
       (_func_int **)&PTR__ChCollisionModelBullet_01187ed0;
  (this->bt_collision_object)._M_t.
  super___uniq_ptr_impl<cbtCollisionObject,_std::default_delete<cbtCollisionObject>_>._M_t.
  super__Tuple_impl<0UL,_cbtCollisionObject_*,_std::default_delete<cbtCollisionObject>_>.
  super__Head_base<0UL,_cbtCollisionObject_*,_false>._M_head_impl = (cbtCollisionObject *)0x0;
  (this->bt_compound_shape).super___shared_ptr<cbtCompoundShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->bt_compound_shape).super___shared_ptr<cbtCompoundShape,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_trimeshes).
  super__Vector_base<std::shared_ptr<chrono::geometry::ChTriangleMesh>,_std::allocator<std::shared_ptr<chrono::geometry::ChTriangleMesh>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bt_compound_shape).super___shared_ptr<cbtCompoundShape,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_trimeshes).
  super__Vector_base<std::shared_ptr<chrono::geometry::ChTriangleMesh>,_std::allocator<std::shared_ptr<chrono::geometry::ChTriangleMesh>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_trimeshes).
  super__Vector_base<std::shared_ptr<chrono::geometry::ChTriangleMesh>,_std::allocator<std::shared_ptr<chrono::geometry::ChTriangleMesh>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_trimeshes).
  super__Vector_base<std::shared_ptr<chrono::geometry::ChTriangleMesh>,_std::allocator<std::shared_ptr<chrono::geometry::ChTriangleMesh>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (cbtCollisionObject *)cbtCollisionObject::operator_new(0x178);
  cbtCollisionObject::cbtCollisionObject(this_00);
  pcVar2 = (puVar1->_M_t).
           super___uniq_ptr_impl<cbtCollisionObject,_std::default_delete<cbtCollisionObject>_>._M_t.
           super__Tuple_impl<0UL,_cbtCollisionObject_*,_std::default_delete<cbtCollisionObject>_>.
           super__Head_base<0UL,_cbtCollisionObject_*,_false>._M_head_impl;
  (puVar1->_M_t).super___uniq_ptr_impl<cbtCollisionObject,_std::default_delete<cbtCollisionObject>_>
  ._M_t.super__Tuple_impl<0UL,_cbtCollisionObject_*,_std::default_delete<cbtCollisionObject>_>.
  super__Head_base<0UL,_cbtCollisionObject_*,_false>._M_head_impl = this_00;
  if (pcVar2 != (cbtCollisionObject *)0x0) {
    (*pcVar2->_vptr_cbtCollisionObject[1])();
    this_00 = (puVar1->_M_t).
              super___uniq_ptr_impl<cbtCollisionObject,_std::default_delete<cbtCollisionObject>_>.
              _M_t.
              super__Tuple_impl<0UL,_cbtCollisionObject_*,_std::default_delete<cbtCollisionObject>_>
              .super__Head_base<0UL,_cbtCollisionObject_*,_false>._M_head_impl;
  }
  (*this_00->_vptr_cbtCollisionObject[2])(this_00,0);
  ((this->bt_collision_object)._M_t.
   super___uniq_ptr_impl<cbtCollisionObject,_std::default_delete<cbtCollisionObject>_>._M_t.
   super__Tuple_impl<0UL,_cbtCollisionObject_*,_std::default_delete<cbtCollisionObject>_>.
   super__Head_base<0UL,_cbtCollisionObject_*,_false>._M_head_impl)->m_userObjectPointer = this;
  return;
}

Assistant:

ChCollisionModelBullet::ChCollisionModelBullet() {
    bt_collision_object = std::unique_ptr<cbtCollisionObject>(new cbtCollisionObject);
    bt_collision_object->setCollisionShape(nullptr);
    bt_collision_object->setUserPointer((void*)this);
}